

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

void __thiscall
QListView::selectionChanged(QListView *this,QItemSelection *selected,QItemSelection *deselected)

{
  char cVar1;
  int iVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<QModelIndex> local_a0;
  Data *local_88;
  QModelIndex *pQStack_80;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_78;
  code *local_68;
  quintptr qStack_60;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_58;
  QModelIndex local_50;
  int local_38;
  undefined4 uStack_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QAccessible::isActive();
  if (cVar1 != '\0') {
    QItemSelection::indexes();
    local_50._0_8_ = (code *)0xffffffffffffffff;
    local_50.i = 0;
    local_50.m.ptr = (QAbstractItemModel *)0x0;
    if (local_78.ptr == (QAbstractItemModel *)0x0) {
      pQStack_80 = &local_50;
    }
    local_68._0_4_ = pQStack_80->r;
    local_68._4_4_ = pQStack_80->c;
    qStack_60 = pQStack_80->i;
    local_58.ptr = (pQStack_80->m).ptr;
    QArrayDataPointer<QModelIndex>::~QArrayDataPointer((QArrayDataPointer<QModelIndex> *)&local_88);
    if (((-1 < (int)local_68) && (-1 < (long)local_68)) &&
       (local_58.ptr != (QAbstractItemModel *)0x0)) {
      iVar2 = visualIndex(this,(QModelIndex *)&local_68);
      local_50._0_8_ = QFont::strikeOut;
      local_50.i = 0xaaaaaaaa00008007;
      _local_38 = CONCAT44(0xaaaaaaaa,iVar2);
      local_50.m.ptr = (QAbstractItemModel *)this;
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_50);
      QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_50);
    }
    QItemSelection::indexes();
    local_50._0_8_ = (code *)0xffffffffffffffff;
    local_50.i = 0;
    local_50.m.ptr = (QAbstractItemModel *)0x0;
    if (local_a0.size == 0) {
      local_a0.ptr = &local_50;
    }
    local_88 = *(Data **)local_a0.ptr;
    pQStack_80 = (QModelIndex *)(local_a0.ptr)->i;
    local_78.ptr = ((local_a0.ptr)->m).ptr;
    QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_a0);
    if (((-1 < (int)local_88) && (-1 < (long)local_88)) &&
       (local_78.ptr != (QAbstractItemModel *)0x0)) {
      iVar2 = visualIndex(this,(QModelIndex *)&local_88);
      local_50._0_8_ = QFont::strikeOut;
      local_50.i = 0xaaaaaaaa00008008;
      _local_38 = CONCAT44(0xaaaaaaaa,iVar2);
      local_50.m.ptr = (QAbstractItemModel *)this;
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_50);
      QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_50);
    }
  }
  QAbstractItemView::selectionChanged((QAbstractItemView *)this,selected,deselected);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QListView::selectionChanged(const QItemSelection &selected,
                                 const QItemSelection &deselected)
{
#if QT_CONFIG(accessibility)
    if (QAccessible::isActive()) {
        // ### does not work properly for selection ranges.
        QModelIndex sel = selected.indexes().value(0);
        if (sel.isValid()) {
            int entry = visualIndex(sel);
            QAccessibleEvent event(this, QAccessible::SelectionAdd);
            event.setChild(entry);
            QAccessible::updateAccessibility(&event);
        }
        QModelIndex desel = deselected.indexes().value(0);
        if (desel.isValid()) {
            int entry = visualIndex(desel);
            QAccessibleEvent event(this, QAccessible::SelectionRemove);
            event.setChild(entry);
            QAccessible::updateAccessibility(&event);
        }
    }
#endif
    QAbstractItemView::selectionChanged(selected, deselected);
}